

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_noframe.c
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int cy;
  int cx;
  ALLEGRO_TIMER *timer;
  int down_y;
  int down_x;
  _Bool down;
  ALLEGRO_EVENT event;
  ALLEGRO_EVENT_QUEUE *events;
  ALLEGRO_BITMAP *bitmap;
  ALLEGRO_DISPLAY *display;
  int local_90;
  int local_8c;
  undefined8 local_88;
  int local_7c;
  int local_78;
  byte local_71;
  int local_70 [8];
  int local_50;
  int local_4c;
  int local_30;
  undefined8 local_28;
  long local_20;
  long local_18;
  undefined4 local_4;
  
  local_4 = 0;
  local_71 = 0;
  local_78 = 0;
  local_7c = 0;
  uVar3 = al_install_system(0x5020700,atexit);
  if ((uVar3 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  al_install_mouse();
  al_install_keyboard();
  al_init_image_addon();
  init_platform_specific();
  al_set_new_display_flags(0x20);
  local_18 = al_create_display(300,200);
  if (local_18 == 0) {
    abort_example("Error creating display\n");
  }
  local_20 = al_load_bitmap("data/fakeamp.bmp");
  if (local_20 == 0) {
    abort_example("Error loading fakeamp.bmp\n");
  }
  local_88 = al_create_timer(0x3fa1111120000000);
  uVar4 = al_create_event_queue();
  local_28 = uVar4;
  uVar5 = al_get_mouse_event_source();
  al_register_event_source(uVar4,uVar5);
  uVar4 = local_28;
  uVar5 = al_get_keyboard_event_source();
  al_register_event_source(uVar4,uVar5);
  uVar4 = local_28;
  uVar5 = al_get_display_event_source(local_18);
  al_register_event_source(uVar4,uVar5);
  uVar4 = local_28;
  uVar5 = al_get_timer_event_source(local_88);
  al_register_event_source(uVar4,uVar5);
  al_start_timer(local_88);
  while( true ) {
    while (al_wait_for_event(local_28,local_70), lVar1 = local_18, local_70[0] == 0x15) {
      if ((local_30 == 1) && (local_50 != 0)) {
        local_71 = 1;
        local_78 = local_50;
        local_7c = local_4c;
      }
      if (local_30 == 2) {
        uVar2 = al_get_display_flags(local_18);
        al_set_display_flag(lVar1,0x20,((uVar2 & 0x20) != 0 ^ 0xffU) & 1);
      }
    }
    if (local_70[0] == 0x2a) break;
    if (local_70[0] == 0x16) {
      if (local_30 == 1) {
        local_71 = 0;
      }
    }
    else if (local_70[0] == 0x14) {
      if (((local_71 & 1) != 0) &&
         (uVar3 = al_get_mouse_cursor_position(&local_8c,&local_90), (uVar3 & 1) != 0)) {
        al_set_window_position(local_18,local_8c - local_78,local_90 - local_7c);
      }
    }
    else {
      if ((local_70[0] == 10) && (local_50 == 0x3b)) break;
      if (local_70[0] == 0x1e) {
        al_draw_bitmap(0,local_20,0);
        al_flip_display();
      }
    }
  }
  al_destroy_timer(local_88);
  al_destroy_event_queue(local_28);
  al_destroy_display(local_18);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_BITMAP *bitmap;
   ALLEGRO_EVENT_QUEUE *events;
   ALLEGRO_EVENT event;
   bool down = false;
   int down_x = 0, down_y = 0;
   ALLEGRO_TIMER *timer;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_install_mouse();
   al_install_keyboard();
   al_init_image_addon();
   init_platform_specific();

   al_set_new_display_flags(ALLEGRO_FRAMELESS);
   display = al_create_display(300, 200);
   if (!display) {
      abort_example("Error creating display\n");
   }
   
   bitmap = al_load_bitmap("data/fakeamp.bmp");
   if (!bitmap) {
      abort_example("Error loading fakeamp.bmp\n");
   }

   timer = al_create_timer(1.0f/30.0f);

   events = al_create_event_queue();
   al_register_event_source(events, al_get_mouse_event_source());
   al_register_event_source(events, al_get_keyboard_event_source());
   al_register_event_source(events, al_get_display_event_source(display));
   al_register_event_source(events, al_get_timer_event_source(timer));

   al_start_timer(timer);

   for (;;) {
      al_wait_for_event(events, &event);
      if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_DOWN) {
         if (event.mouse.button == 1 && event.mouse.x) {
            down = true;
            down_x = event.mouse.x;
            down_y = event.mouse.y;
         }
         if (event.mouse.button == 2) {
            al_set_display_flag(display, ALLEGRO_FRAMELESS,
               !(al_get_display_flags(display) & ALLEGRO_FRAMELESS));
         }
      }
      else if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
      else if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_UP) {
         if (event.mouse.button == 1) {
            down = false;
         }
      }
      else if (event.type == ALLEGRO_EVENT_MOUSE_AXES) {
         if (down) {
            int cx, cy;
            if (al_get_mouse_cursor_position(&cx, &cy)) {
               al_set_window_position(display, cx - down_x, cy - down_y);
            }
         }
      }
      else if (event.type == ALLEGRO_EVENT_KEY_DOWN &&
	    event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
         break;
      }
      else if (event.type == ALLEGRO_EVENT_TIMER) {
         al_draw_bitmap(bitmap, 0, 0, 0);
         al_flip_display();
      }
   }

   al_destroy_timer(timer);
   al_destroy_event_queue(events);
   al_destroy_display(display);

   return 0;
}